

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupCycled(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  undefined8 uVar1;
  int *pInitState;
  Gia_Man_t *pGVar2;
  uint uVar3;
  uint uVar4;
  ulong __size;
  int iVar5;
  uint uVar6;
  
  Gia_ManCleanMark0(p);
  Gia_ManCycle(p,pCex,nFrames);
  uVar3 = p->nRegs;
  iVar5 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  if (iVar5 == 0) {
    pInitState = (int *)0x0;
  }
  else {
    pInitState = (int *)malloc((long)iVar5 << 2);
  }
  if (0 < (int)uVar3) {
    uVar6 = iVar5 * 0x20;
    uVar4 = 0;
    do {
      iVar5 = p->vCis->nSize;
      uVar3 = (iVar5 - uVar3) + uVar4;
      if (((int)uVar3 < 0) || (iVar5 <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCis->pArray[uVar3];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(undefined8 *)(p->pObjs + iVar5);
      if (uVar4 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pInitState == (int *)0x0) {
            pInitState = (int *)malloc(4);
          }
          else {
            pInitState = (int *)realloc(pInitState,4);
          }
          uVar6 = 0x20;
          if (pInitState == (int *)0x0) {
LAB_001d9a29:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
          }
        }
        else {
          __size = (ulong)((uVar6 >> 4) * 4);
          if (pInitState == (int *)0x0) {
            pInitState = (int *)malloc(__size);
          }
          else {
            pInitState = (int *)realloc(pInitState,__size);
          }
          if (pInitState == (int *)0x0) goto LAB_001d9a29;
          uVar6 = (uVar6 >> 4) * 0x20;
        }
      }
      uVar3 = 1 << ((byte)uVar4 & 0x1f);
      if (((uint)uVar1 >> 0x1e & 1) == 0) {
        pInitState[uVar4 >> 5] = pInitState[uVar4 >> 5] & ~uVar3;
      }
      else {
        pInitState[uVar4 >> 5] = pInitState[uVar4 >> 5] | uVar3;
      }
      uVar4 = uVar4 + 1;
      uVar3 = p->nRegs;
    } while ((int)uVar4 < (int)uVar3);
  }
  pGVar2 = Gia_ManDupFlip(p,pInitState);
  if (pInitState != (int *)0x0) {
    free(pInitState);
  }
  Gia_ManCleanMark0(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManDupCycled( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Man_t * pNew;
    Vec_Bit_t * vInits;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0(p);
    Gia_ManCycle( p, pCex, nFrames );
    vInits = Vec_BitAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        Vec_BitPush( vInits, pObj->fMark0 );
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInits) );
    Vec_BitFree( vInits );
    Gia_ManCleanMark0(p);
    return pNew;
}